

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void opj_pi_destroy(opj_pi_iterator_t *p_pi,OPJ_UINT32 p_nb_elements)

{
  long lVar1;
  opj_pi_resolution_t *local_30;
  opj_pi_comp_t *l_current_component;
  opj_pi_iterator_t *l_current_pi;
  uint local_18;
  OPJ_UINT32 pino;
  OPJ_UINT32 compno;
  OPJ_UINT32 p_nb_elements_local;
  opj_pi_iterator_t *p_pi_local;
  
  if (p_pi != (opj_pi_iterator_t *)0x0) {
    if (p_pi->include != (OPJ_INT16 *)0x0) {
      opj_free(p_pi->include);
      p_pi->include = (OPJ_INT16 *)0x0;
    }
    l_current_component = (opj_pi_comp_t *)p_pi;
    for (l_current_pi._4_4_ = 0; l_current_pi._4_4_ < p_nb_elements;
        l_current_pi._4_4_ = l_current_pi._4_4_ + 1) {
      if (l_current_component[8].resolutions != (opj_pi_resolution_t *)0x0) {
        local_30 = l_current_component[8].resolutions;
        for (local_18 = 0; local_18 < *(uint *)&l_current_component[8].field_0xc;
            local_18 = local_18 + 1) {
          lVar1._0_4_ = local_30[1].pdx;
          lVar1._4_4_ = local_30[1].pdy;
          if (lVar1 != 0) {
            opj_free(*(void **)(local_30 + 1));
            local_30[1].pdx = 0;
            local_30[1].pdy = 0;
          }
          local_30 = (opj_pi_resolution_t *)&local_30[1].pw;
        }
        opj_free(l_current_component[8].resolutions);
        l_current_component[8].resolutions = (opj_pi_resolution_t *)0x0;
      }
      l_current_component = (opj_pi_comp_t *)&l_current_component[10].resolutions;
    }
    opj_free(p_pi);
  }
  return;
}

Assistant:

void opj_pi_destroy(opj_pi_iterator_t *p_pi,
                    OPJ_UINT32 p_nb_elements)
{
    OPJ_UINT32 compno, pino;
    opj_pi_iterator_t *l_current_pi = p_pi;
    if (p_pi) {
        if (p_pi->include) {
            opj_free(p_pi->include);
            p_pi->include = 00;
        }
        for (pino = 0; pino < p_nb_elements; ++pino) {
            if (l_current_pi->comps) {
                opj_pi_comp_t *l_current_component = l_current_pi->comps;
                for (compno = 0; compno < l_current_pi->numcomps; compno++) {
                    if (l_current_component->resolutions) {
                        opj_free(l_current_component->resolutions);
                        l_current_component->resolutions = 00;
                    }

                    ++l_current_component;
                }
                opj_free(l_current_pi->comps);
                l_current_pi->comps = 0;
            }
            ++l_current_pi;
        }
        opj_free(p_pi);
    }
}